

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O1

int __thiscall
ncnn::Gemm::forward_int8
          (Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  Mat *pMVar2;
  void *pvVar3;
  pointer pMVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  Gemm *pGVar10;
  int iVar11;
  long lVar12;
  size_t *psVar13;
  ulong uVar14;
  long lVar15;
  size_t sVar16;
  pointer pMVar17;
  long lVar18;
  Allocator **ppAVar19;
  uint uVar20;
  void *pvVar21;
  int *piVar22;
  uint uVar23;
  ulong uVar24;
  int *piVar25;
  float *ptrC;
  int iVar26;
  Mat *pMVar27;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar28;
  size_t sVar29;
  long lVar30;
  void *pvVar31;
  Allocator *pAVar32;
  float fVar33;
  float fVar34;
  uint uVar36;
  undefined1 auVar35 [12];
  uint uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  float fVar42;
  float fVar43;
  Mat local_238;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1f0;
  undefined1 local_1e8 [40];
  undefined1 local_1c0 [16];
  int local_1b0;
  size_t local_1a8;
  Gemm *local_1a0;
  Mat local_198;
  undefined1 local_148 [44];
  uint uStack_11c;
  undefined8 uStack_118;
  int local_110;
  size_t local_108;
  int local_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [40];
  undefined1 local_c0 [16];
  int local_b0;
  size_t local_a8;
  undefined1 local_98 [16];
  Allocator *local_88;
  size_t *local_80;
  int *local_78;
  long local_70;
  void *local_68;
  void *local_60;
  Mat *local_58;
  long local_50;
  undefined1 local_48 [16];
  
  pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar27 = pMVar2 + 1;
  if (this->constantA != 0) {
    pMVar27 = pMVar2;
    pMVar2 = &this->A_data;
  }
  if (this->constantB != 0) {
    pMVar27 = &this->B_data;
  }
  local_238.cstep = 0;
  local_238.data = (void *)0x0;
  local_238.refcount._0_4_ = 0;
  local_238.refcount._4_4_ = 0;
  local_238.elemsize._0_4_ = 0;
  local_238.elemsize._4_4_ = 0;
  local_238.elempack = 0;
  local_238.allocator = (Allocator *)0x0;
  local_238.dims = 0;
  local_238.w = 0;
  local_238.h = 0;
  local_238.d = 0;
  local_238.c = 0;
  local_1f0 = bottom_blobs;
  if (this->transA == 0) {
    if (&local_238 != pMVar2) {
      piVar22 = pMVar2->refcount;
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + 1;
        UNLOCK();
      }
      local_238.data = pMVar2->data;
      local_238.refcount._0_4_ = SUB84(pMVar2->refcount,0);
      local_238.refcount._4_4_ = (undefined4)((ulong)pMVar2->refcount >> 0x20);
      local_238.elemsize._0_4_ = (undefined4)pMVar2->elemsize;
      local_238.elemsize._4_4_ = (undefined4)(pMVar2->elemsize >> 0x20);
      local_238.elempack = pMVar2->elempack;
      local_238.allocator = pMVar2->allocator;
      uVar5 = pMVar2->dims;
      uVar6 = pMVar2->w;
      uVar7 = pMVar2->h;
      uVar8 = pMVar2->d;
      local_238.w = uVar6;
      local_238.h = uVar7;
      local_238.d = uVar8;
      local_238.c = pMVar2->c;
      local_238.cstep = pMVar2->cstep;
      local_238.dims = uVar5;
    }
  }
  else if (pMVar2->elemsize == 1) {
    Mat::create(&local_238,pMVar2->h,pMVar2->w,1,1,opt->workspace_allocator);
    if (0 < local_238.h) {
      lVar12 = 0;
      do {
        if (0 < (long)local_238.w) {
          lVar15 = 0;
          do {
            *(undefined1 *)
             ((long)local_238.data +
             lVar15 + CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize) * lVar12 *
                      (long)local_238.w) =
                 *(undefined1 *)
                  ((long)pMVar2->data + lVar12 + pMVar2->w * lVar15 * pMVar2->elemsize);
            lVar15 = lVar15 + 1;
          } while (lVar15 < local_238.w);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < local_238.h);
    }
  }
  else {
    Mat::create(&local_238,(&pMVar2->h)[(ulong)(pMVar2->dims == 3) * 2],pMVar2->w,4,1,
                opt->workspace_allocator);
    if (0 < local_238.h) {
      lVar12 = 0;
      pvVar21 = local_238.data;
      do {
        if (0 < local_238.w) {
          iVar11 = pMVar2->dims;
          sVar16 = pMVar2->elemsize;
          pvVar3 = pMVar2->data;
          lVar15 = 0;
          do {
            if (iVar11 == 3) {
              sVar29 = pMVar2->cstep;
            }
            else {
              sVar29 = (size_t)pMVar2->w;
            }
            *(undefined4 *)((long)pvVar21 + lVar15 * 4) =
                 *(undefined4 *)((long)pvVar3 + sVar29 * lVar15 * sVar16 + lVar12 * 4);
            lVar15 = lVar15 + 1;
          } while (lVar15 < local_238.w);
        }
        lVar12 = lVar12 + 1;
        pvVar21 = (void *)((long)pvVar21 +
                          CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize) *
                          (long)local_238.w);
      } while (lVar12 < local_238.h);
    }
  }
  piVar22 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  local_148._0_8_ = local_238.data;
  local_148._8_4_ = local_238.refcount._0_4_;
  local_148._12_4_ = local_238.refcount._4_4_;
  local_148._16_8_ = CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
  local_148._24_4_ = local_238.elempack;
  local_148._32_8_ = local_238.allocator;
  uStack_11c = local_238.w;
  local_148._40_4_ = local_238.dims;
  uStack_118._4_4_ = local_238.d;
  uStack_118._0_4_ = local_238.h;
  local_110 = local_238.c;
  local_108 = local_238.cstep;
  if (piVar22 != (int *)0x0) {
    LOCK();
    *piVar22 = *piVar22 + 1;
    UNLOCK();
  }
  local_e8._0_8_ = (this->A_data_int8_scales).data;
  piVar22 = (this->A_data_int8_scales).refcount;
  local_e8._8_4_ = SUB84(piVar22,0);
  local_e8._12_4_ = (undefined4)((ulong)piVar22 >> 0x20);
  local_e8._16_8_ = (this->A_data_int8_scales).elemsize;
  local_e8._24_4_ = (this->A_data_int8_scales).elempack;
  local_e8._32_8_ = (this->A_data_int8_scales).allocator;
  local_c0._0_4_ = (this->A_data_int8_scales).dims;
  local_c0._4_4_ = (this->A_data_int8_scales).w;
  local_c0._8_4_ = (this->A_data_int8_scales).h;
  local_c0._12_4_ = (this->A_data_int8_scales).d;
  local_b0 = (this->A_data_int8_scales).c;
  local_a8 = (this->A_data_int8_scales).cstep;
  if (piVar22 != (int *)0x0) {
    LOCK();
    *piVar22 = *piVar22 + 1;
    UNLOCK();
  }
  local_1a0 = this;
  if (local_148._16_8_ != 1) {
    Mat::create((Mat *)local_148,local_238.w,(&local_238.h)[(ulong)(local_238.dims == 3) * 2],1,1,
                opt->workspace_allocator);
    Mat::create((Mat *)local_e8,(uint)uStack_118,4,1,opt->workspace_allocator);
    if (0 < (int)(uint)uStack_118) {
      lVar12 = 0;
      do {
        uVar9 = local_148._0_8_;
        pvVar21 = local_238.data;
        psVar13 = (size_t *)&local_238.w;
        if (local_238.dims == 3) {
          psVar13 = &local_238.cstep;
        }
        sVar16 = *psVar13;
        lVar15 = (long)(int)uStack_11c;
        fVar34 = 0.0;
        fVar33 = 0.0;
        if (0 < lVar15) {
          lVar18 = 0;
          do {
            fVar33 = ABS(*(float *)((long)local_238.data +
                                   lVar18 * 4 + (long)((int)sVar16 * (int)lVar12) * 4));
            if (fVar34 <= fVar33) {
              fVar34 = fVar33;
            }
            lVar18 = lVar18 + 1;
            fVar33 = fVar34;
          } while (lVar15 != lVar18);
        }
        fVar34 = (float)(-(uint)(fVar33 == 0.0) & 0x3f800000 |
                        ~-(uint)(fVar33 == 0.0) & (uint)(127.0 / fVar33));
        *(float *)(local_e8._0_8_ + lVar12 * 4) = fVar34;
        if (0 < (int)uStack_11c) {
          lVar18 = local_148._16_8_ * lVar12;
          lVar30 = 0;
          local_f8 = ZEXT416((uint)fVar34);
          do {
            fVar34 = roundf(*(float *)((long)pvVar21 +
                                      lVar30 * 4 + (long)((int)sVar16 * (int)lVar12) * 4) * fVar34);
            iVar11 = (int)fVar34;
            if (iVar11 < -0x7e) {
              iVar11 = -0x7f;
            }
            if (0x7e < iVar11) {
              iVar11 = 0x7f;
            }
            *(char *)(uVar9 + lVar30 + lVar18 * lVar15) = (char)iVar11;
            lVar30 = lVar30 + 1;
            fVar34 = (float)local_f8._0_4_;
          } while (lVar30 < (int)uStack_11c);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < (int)(uint)uStack_118);
    }
  }
  pGVar10 = local_1a0;
  local_1e8._0_8_ = pMVar27->data;
  piVar22 = pMVar27->refcount;
  local_1e8._8_4_ = SUB84(piVar22,0);
  local_1e8._12_4_ = (undefined4)((ulong)piVar22 >> 0x20);
  local_1e8._16_8_ = pMVar27->elemsize;
  local_1e8._24_4_ = pMVar27->elempack;
  local_1e8._32_8_ = pMVar27->allocator;
  local_1c0._0_4_ = pMVar27->dims;
  local_1c0._4_4_ = pMVar27->w;
  local_1c0._8_4_ = pMVar27->h;
  local_1c0._12_4_ = pMVar27->d;
  local_1b0 = pMVar27->c;
  local_1a8 = pMVar27->cstep;
  if (piVar22 != (int *)0x0) {
    LOCK();
    *piVar22 = *piVar22 + 1;
    UNLOCK();
  }
  if (local_1e8._16_8_ == 1) {
    local_f8 = ZEXT416((uint)local_1a0->B_data_int8_scale);
  }
  else {
    Mat::create((Mat *)local_1e8,pMVar27->w,(&pMVar27->h)[(ulong)(pMVar27->dims == 3) * 2],1,1,
                opt->workspace_allocator);
    fVar34 = 0.0;
    if (0 < (int)local_1c0._8_4_) {
      iVar11 = 0;
      do {
        if (pMVar27->dims == 3) {
          iVar26 = (int)pMVar27->cstep;
        }
        else {
          iVar26 = pMVar27->w;
        }
        if (0 < (int)local_1c0._4_4_) {
          uVar14 = 0;
          do {
            fVar33 = ABS(*(float *)((long)pMVar27->data + uVar14 * 4 + (long)(iVar26 * iVar11) * 4))
            ;
            if (fVar34 <= fVar33) {
              fVar34 = fVar33;
            }
            uVar14 = uVar14 + 1;
          } while ((uint)local_1c0._4_4_ != uVar14);
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 != local_1c0._8_4_);
    }
    local_f8 = ZEXT416(-(uint)(fVar34 == 0.0) & 0x3f800000 |
                       ~-(uint)(fVar34 == 0.0) & (uint)(127.0 / fVar34));
    if (0 < (int)local_1c0._8_4_) {
      lVar12 = 0;
      do {
        uVar9 = local_1e8._0_8_;
        if (pMVar27->dims == 3) {
          iVar11 = (int)pMVar27->cstep;
        }
        else {
          iVar11 = pMVar27->w;
        }
        lVar15 = (long)(int)local_1c0._4_4_;
        if (0 < lVar15) {
          pvVar21 = pMVar27->data;
          lVar30 = local_1e8._16_8_ * lVar12;
          lVar18 = 0;
          do {
            fVar34 = roundf(*(float *)((long)pvVar21 + lVar18 * 4 + (long)(iVar11 * (int)lVar12) * 4
                                      ) * (float)local_f8._0_4_);
            iVar26 = (int)fVar34;
            if (iVar26 < -0x7e) {
              iVar26 = -0x7f;
            }
            if (0x7e < iVar26) {
              iVar26 = 0x7f;
            }
            *(char *)(uVar9 + lVar18 + lVar30 * lVar15) = (char)iVar26;
            lVar18 = lVar18 + 1;
          } while (lVar18 < (int)local_1c0._4_4_);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < (int)local_1c0._8_4_);
    }
  }
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize._0_4_ = 0;
  local_198.elemsize._4_4_ = 0;
  local_198.elempack = 0;
  local_198.allocator = (Allocator *)0x0;
  local_198.dims = 0;
  local_198.w = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  if (pGVar10->transB == 0) {
    Mat::create(&local_198,local_1c0._8_4_,local_1c0._4_4_,1,1,opt->workspace_allocator);
    if (0 < local_198.h) {
      lVar12 = 0;
      do {
        if (0 < (long)local_198.w) {
          lVar15 = 0;
          do {
            *(undefined1 *)
             ((long)local_198.data +
             lVar15 + CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize) * lVar12 *
                      (long)local_198.w) =
                 *(undefined1 *)
                  (local_1e8._0_8_ + lVar12 + (int)local_1c0._4_4_ * lVar15 * local_1e8._16_8_);
            lVar15 = lVar15 + 1;
          } while (lVar15 < local_198.w);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < local_198.h);
    }
  }
  else {
    piVar22 = (int *)CONCAT44(local_1e8._12_4_,local_1e8._8_4_);
    if (piVar22 != (int *)0x0) {
      LOCK();
      *piVar22 = *piVar22 + 1;
      UNLOCK();
    }
    local_198.data = (void *)local_1e8._0_8_;
    local_198.refcount._0_4_ = local_1e8._8_4_;
    local_198.refcount._4_4_ = local_1e8._12_4_;
    local_198.elemsize._0_4_ = (undefined4)local_1e8._16_8_;
    local_198.elemsize._4_4_ = SUB84(local_1e8._16_8_,4);
    local_198.elempack = local_1e8._24_4_;
    local_198.allocator = (Allocator *)local_1e8._32_8_;
    local_198.dims = local_1c0._0_4_;
    local_198.d = local_1c0._12_4_;
    local_198.c = local_1b0;
    local_198.cstep = local_1a8;
    local_198.w = local_1c0._4_4_;
    local_198.h = local_1c0._8_4_;
  }
  if (pGVar10->constantC != 0) {
    piVar22 = (pGVar10->C_data).refcount;
    if (piVar22 != (int *)0x0) {
      LOCK();
      *piVar22 = *piVar22 + 1;
      UNLOCK();
    }
    local_98._0_8_ = (pGVar10->C_data).data;
    local_98._8_8_ = (pGVar10->C_data).refcount;
    pAVar32 = (pGVar10->C_data).allocator;
    uVar20 = pGVar10->constant_broadcast_type_C;
    goto LAB_004b3500;
  }
  if ((pGVar10->constantB == 0 || pGVar10->constantA == 0) ||
     (pMVar17 = (local_1f0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start,
     (long)(local_1f0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_finish - (long)pMVar17 != 0x48)) {
    if ((pGVar10->constantA != 0 || pGVar10->constantB != 0) &&
       (pMVar4 = (local_1f0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start,
       (long)(local_1f0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)pMVar4 == 0x90)) {
      piVar22 = pMVar4[1].refcount;
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + 1;
        UNLOCK();
      }
      pMVar17 = pMVar4 + 1;
      ppAVar19 = &pMVar4[1].allocator;
      piVar22 = &pMVar4[1].dims;
      piVar25 = &pMVar4[1].c;
      psVar13 = &pMVar4[1].cstep;
      goto LAB_004b38cb;
    }
    pMVar4 = (local_1f0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(local_1f0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar4 == 0xd8) {
      piVar22 = pMVar4[2].refcount;
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + 1;
        UNLOCK();
      }
      pMVar17 = pMVar4 + 2;
      ppAVar19 = &pMVar4[2].allocator;
      piVar22 = &pMVar4[2].dims;
      piVar25 = &pMVar4[2].c;
      psVar13 = &pMVar4[2].cstep;
      goto LAB_004b38cb;
    }
    uVar38 = 0;
    uVar39 = 0;
    uVar40 = 0;
    uVar41 = 0;
    auVar35 = SUB1612(ZEXT816(0),0);
    sVar16 = 0;
    pAVar32 = (Allocator *)0x0;
    lVar12 = 0;
  }
  else {
    piVar22 = pMVar17->refcount;
    if (piVar22 != (int *)0x0) {
      LOCK();
      *piVar22 = *piVar22 + 1;
      UNLOCK();
    }
    ppAVar19 = &pMVar17->allocator;
    piVar22 = &pMVar17->dims;
    piVar25 = &pMVar17->c;
    psVar13 = &pMVar17->cstep;
LAB_004b38cb:
    uVar38 = *(undefined4 *)&pMVar17->data;
    uVar39 = *(undefined4 *)((long)&pMVar17->data + 4);
    uVar40 = *(undefined4 *)&pMVar17->refcount;
    uVar41 = *(undefined4 *)((long)&pMVar17->refcount + 4);
    auVar35 = SUB1612(*(undefined1 (*) [16])piVar22,0);
    lVar12 = (long)*piVar25;
    pAVar32 = *ppAVar19;
    sVar16 = *psVar13;
  }
  local_98._4_4_ = uVar39;
  local_98._0_4_ = uVar38;
  local_98._8_4_ = uVar40;
  local_98._12_4_ = uVar41;
  uVar20 = 0;
  if ((CONCAT44(uVar39,uVar38) != 0) && (sVar16 * lVar12 != 0)) {
    iVar11 = auVar35._0_4_;
    uVar36 = auVar35._4_4_;
    uVar37 = auVar35._8_4_;
    uVar20 = (uint)(uVar36 == (uint)uStack_118 && iVar11 == 1);
    uVar23 = uVar20;
    if (uVar36 == local_198.h) {
      uVar23 = 4;
    }
    if (iVar11 != 1) {
      uVar23 = uVar20;
    }
    uVar20 = 2;
    if (uVar37 != (uint)uStack_118) {
      uVar20 = uVar23;
    }
    if (uVar36 != 1) {
      uVar20 = uVar23;
    }
    if (iVar11 != 2) {
      uVar20 = uVar23;
    }
    uVar23 = 3;
    if (uVar37 != (uint)uStack_118) {
      uVar23 = uVar20;
    }
    if (uVar36 != local_198.h) {
      uVar23 = uVar20;
    }
    if ((iVar11 == 2) && (uVar20 = uVar23, uVar37 == 1 && uVar36 == local_198.h)) {
      uVar20 = 4;
    }
  }
LAB_004b3500:
  pMVar27 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar23 = local_198.h;
  uVar36 = (uint)uStack_118;
  if (pGVar10->output_transpose == 0) {
    uVar23 = (uint)uStack_118;
    uVar36 = local_198.h;
  }
  local_48._0_8_ = local_98._8_8_;
  local_48._8_4_ = local_98._8_4_;
  local_48._12_4_ = local_98._12_4_;
  if (pGVar10->output_N1M == 0) {
    Mat::create(pMVar27,uVar36,uVar23,4,opt->blob_allocator);
  }
  else {
    Mat::create(pMVar27,uVar36,1,uVar23,4,opt->blob_allocator);
  }
  iVar11 = -100;
  if ((pMVar27->data != (void *)0x0) && ((long)pMVar27->c * pMVar27->cstep != 0)) {
    local_1f0 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(long)(int)(uint)uStack_118;
    if ((long)local_1f0 < 1) {
      iVar11 = 0;
    }
    else {
      fVar34 = local_1a0->alpha;
      fVar33 = local_1a0->beta;
      iVar11 = local_1a0->output_transpose;
      local_fc = pMVar27->dims;
      local_60 = (void *)local_e8._0_8_;
      local_68 = local_198.data;
      local_70 = (long)local_198.h;
      local_1a0 = (Gemm *)((long)local_198.w *
                          CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize));
      local_50 = (long)(int)uStack_11c * local_148._16_8_;
      pvVar28 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x0;
      local_78 = &pMVar27->w;
      local_80 = &pMVar27->cstep;
      pvVar21 = (void *)local_148._0_8_;
      do {
        if (0 < local_198.h) {
          fVar1 = *(float *)(local_e8._0_8_ + (long)pvVar28 * 4);
          psVar13 = (size_t *)local_78;
          if (local_fc == 3) {
            psVar13 = local_80;
          }
          sVar16 = *psVar13;
          pvVar3 = pMVar27->data;
          uVar14 = 0;
          pvVar31 = local_198.data;
          do {
            if ((int)uStack_11c < 1) {
              fVar42 = 0.0;
            }
            else {
              uVar24 = 0;
              iVar26 = 0;
              do {
                iVar26 = iVar26 + (int)*(char *)((long)pvVar31 + uVar24) *
                                  (int)*(char *)((long)pvVar21 + uVar24);
                uVar24 = uVar24 + 1;
              } while (uStack_11c != uVar24);
              fVar42 = (float)iVar26;
            }
            fVar42 = fVar42 * (1.0 / (fVar1 * (float)local_f8._0_4_));
            if ((float *)local_98._0_8_ != (float *)0x0) {
              fVar43 = 0.0;
              if (uVar20 == 0) {
                fVar43 = *(float *)local_98._0_8_;
              }
              if (uVar20 == 1) {
                fVar43 = *(float *)(local_98._0_8_ + pvVar28 * 4);
              }
              if (uVar20 == 2) {
                fVar43 = *(float *)(local_98._0_8_ + pvVar28 * 4);
              }
              if (uVar20 == 3) {
                fVar43 = *(float *)(local_98._0_8_ + ((long)pvVar28 * local_70 + uVar14) * 4);
              }
              if (uVar20 == 4) {
                fVar43 = *(float *)(local_98._0_8_ + uVar14 * 4);
              }
              fVar42 = fVar42 + fVar43 * fVar33;
            }
            lVar12 = uVar14 * (long)(int)sVar16 * 4 + (long)pvVar28 * 4;
            if (iVar11 == 0) {
              lVar12 = uVar14 * 4 + (long)pvVar28 * (long)(int)sVar16 * 4;
            }
            *(float *)((long)pvVar3 + lVar12) = fVar42 * fVar34;
            uVar14 = uVar14 + 1;
            pvVar31 = (void *)((long)pvVar31 + (long)local_1a0);
          } while (uVar14 != (uint)local_198.h);
        }
        pvVar28 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                  ((long)&(pvVar28->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start + 1);
        pvVar21 = (void *)((long)pvVar21 + local_50);
      } while (pvVar28 != local_1f0);
      iVar11 = 0;
      local_88 = pAVar32;
      local_58 = pMVar27;
    }
  }
  if ((int *)local_48._0_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_48._0_8_ = *(int *)local_48._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_48._0_8_ == 0) {
      if (pAVar32 == (Allocator *)0x0) {
        if ((float *)local_98._0_8_ != (float *)0x0) {
          free((void *)local_98._0_8_);
        }
      }
      else {
        (*pAVar32->_vptr_Allocator[3])(pAVar32);
      }
    }
  }
  piVar22 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar22 != (int *)0x0) {
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize._0_4_ = 0;
  local_198.elemsize._4_4_ = 0;
  local_198.elempack = 0;
  local_198.dims = 0;
  local_198.w = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  piVar22 = (int *)CONCAT44(local_1e8._12_4_,local_1e8._8_4_);
  if (piVar22 != (int *)0x0) {
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 == 0) {
      if ((Allocator *)local_1e8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_1e8._0_8_ != (void *)0x0) {
          free((void *)local_1e8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_1e8._32_8_)[3])();
      }
    }
  }
  local_1a8 = 0;
  local_1e8._0_8_ = (void *)0x0;
  local_1e8._8_4_ = 0;
  local_1e8._12_4_ = 0;
  local_1e8._16_8_ = 0;
  local_1e8._24_4_ = 0;
  local_1c0 = (undefined1  [16])0x0;
  local_1b0 = 0;
  piVar22 = (int *)CONCAT44(local_e8._12_4_,local_e8._8_4_);
  if (piVar22 != (int *)0x0) {
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 == 0) {
      if ((Allocator *)local_e8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_e8._0_8_ != (void *)0x0) {
          free((void *)local_e8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_e8._32_8_)[3])();
      }
    }
  }
  local_a8 = 0;
  local_e8._0_8_ = (void *)0x0;
  local_e8._8_4_ = 0;
  local_e8._12_4_ = 0;
  local_e8._16_8_ = 0;
  local_e8._24_4_ = 0;
  local_c0 = (undefined1  [16])0x0;
  local_b0 = 0;
  piVar22 = (int *)CONCAT44(local_148._12_4_,local_148._8_4_);
  if (piVar22 != (int *)0x0) {
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 == 0) {
      if ((Allocator *)local_148._32_8_ == (Allocator *)0x0) {
        if ((void *)local_148._0_8_ != (void *)0x0) {
          free((void *)local_148._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_148._32_8_)[3])();
      }
    }
  }
  local_108 = 0;
  local_148._0_8_ = (void *)0x0;
  local_148._8_4_ = 0;
  local_148._12_4_ = 0;
  local_148._16_8_ = 0;
  local_148._24_4_ = 0;
  stack0xfffffffffffffee0 = (undefined1  [16])0x0;
  local_110 = 0;
  piVar22 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar22 != (int *)0x0) {
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if (local_238.data != (void *)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar11;
}

Assistant:

int Gemm::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A0 = constantA ? A_data : bottom_blobs[0];
    const Mat& B0 = constantB ? B_data : constantA ? bottom_blobs[0] : bottom_blobs[1];

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        if (A0.elemsize == 1)
        {
            A.create(A0.h, A0.w, (size_t)1u, 1, opt.workspace_allocator);

            for (int i = 0; i < A.h; i++)
            {
                signed char* ptr = A.row<signed char>(i);
                for (int j = 0; j < A.w; j++)
                {
                    ptr[j] = A0.row<const signed char>(j)[i];
                }
            }
        }
        else
        {
            A.create(A0.dims == 3 ? A0.c : A0.h, A0.w, (size_t)4u, 1, opt.workspace_allocator);

            for (int i = 0; i < A.h; i++)
            {
                float* ptr = A.row(i);
                for (int j = 0; j < A.w; j++)
                {
                    ptr[j] = A0.dims == 3 ? A0.channel(j)[i] : A0.row(j)[i];
                }
            }
        }
    }

    // dynamic quantize A
    Mat A_int8 = A;
    Mat A_int8_scales = A_data_int8_scales;
    if (A_int8.elemsize != 1)
    {
        A_int8.create(A.w, A.dims == 3 ? A.c : A.h, (size_t)1u, 1, opt.workspace_allocator);
        A_int8_scales.create(A_int8.h, (size_t)4u, 1, opt.workspace_allocator);

        for (int i = 0; i < A_int8.h; i++)
        {
            const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;
            const float* ptr = (const float*)A + i * A_hstep;

            float absmax = 0.f;
            for (int k = 0; k < A_int8.w; k++)
            {
                absmax = std::max(absmax, (float)fabs(ptr[k]));
            }

            float A_int8_scale = absmax == 0.f ? 1.f : 127.f / absmax;
            A_int8_scales[i] = A_int8_scale;

            signed char* ptrAi = A_int8.row<signed char>(i);

            for (int k = 0; k < A_int8.w; k++)
            {
                ptrAi[k] = float2int8(ptr[k] * A_int8_scale);
            }
        }
    }

    // dynamic quantize B
    Mat B0_int8 = B0;
    float B_int8_scale = B_data_int8_scale;
    if (B0_int8.elemsize != 1)
    {
        B0_int8.create(B0.w, B0.dims == 3 ? B0.c : B0.h, (size_t)1u, 1, opt.workspace_allocator);

        float absmax = 0.f;
        for (int i = 0; i < B0_int8.h; i++)
        {
            const int B_hstep = B0.dims == 3 ? (int)B0.cstep : B0.w;
            const float* ptr = (const float*)B0 + i * B_hstep;

            for (int k = 0; k < B0_int8.w; k++)
            {
                absmax = std::max(absmax, (float)fabs(ptr[k]));
            }
        }

        B_int8_scale = absmax == 0.f ? 1.f : 127.f / absmax;

        for (int i = 0; i < B0_int8.h; i++)
        {
            const int B_hstep = B0.dims == 3 ? (int)B0.cstep : B0.w;
            const float* ptr = (const float*)B0 + i * B_hstep;

            signed char* ptrBi = B0_int8.row<signed char>(i);

            for (int k = 0; k < B0_int8.w; k++)
            {
                ptrBi[k] = float2int8(ptr[k] * B_int8_scale);
            }
        }
    }

    Mat BT_int8;
    if (transB == 0)
    {
        // transpose B to col-major
        BT_int8.create(B0_int8.h, B0_int8.w, (size_t)1u, 1, opt.workspace_allocator);

        for (int i = 0; i < BT_int8.h; i++)
        {
            signed char* ptr = BT_int8.row<signed char>(i);
            for (int j = 0; j < BT_int8.w; j++)
            {
                ptr[j] = B0_int8.row<const signed char>(j)[i];
            }
        }
    }
    else
    {
        BT_int8 = B0_int8;
    }

    const int M = A_int8.h;
    const int N = BT_int8.h;

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = C_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB && bottom_blobs.size() == 1)
        {
            C = bottom_blobs[0];
        }
        else if ((constantA || constantB) && bottom_blobs.size() == 2)
        {
            C = bottom_blobs[1];
        }
        else if (bottom_blobs.size() == 3)
        {
            C = bottom_blobs[2];
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N, 4u, opt.blob_allocator);
        else
            top_blob.create(M, N, 4u, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M, 4u, opt.blob_allocator);
        else
            top_blob.create(N, M, 4u, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    gemm_transB_int8(A_int8, BT_int8, A_int8_scales, B_int8_scale, C, top_blob, alpha, beta, broadcast_type_C, output_transpose, opt);

    return 0;
}